

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<std::complex<double>_> *sol,
          TPZSolVec<std::complex<double>_> *curlSol)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  TPZManVector<std::complex<double>,_10> *pTVar5;
  TNode *pTVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  long *plVar11;
  TPZCompMesh *pTVar12;
  TPZFMatrix<std::complex<double>_> *this_00;
  complex<double> *pcVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int coord;
  long lVar19;
  long col;
  long iSol;
  bool bVar20;
  double dVar21;
  double extraout_XMM0_Qa;
  complex<double> local_48;
  
  plVar11 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar11 + 0x78))(plVar11);
  iVar10 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x90))(this);
  pTVar12 = TPZCompEl::Mesh((TPZCompEl *)this);
  this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar12->fSolution);
  lVar17 = (this_00->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>)._vptr_TPZVec[3])(sol,lVar17);
  (*(curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>)._vptr_TPZVec[3])(curlSol);
  lVar19 = 0;
  if (lVar17 < 1) {
    lVar17 = lVar19;
  }
  lVar18 = lVar17;
  while (bVar20 = lVar18 != 0, lVar18 = lVar18 + -1, bVar20) {
    pTVar5 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
    (**(code **)(*(long *)((long)&(((TPZManVector<std::complex<double>,_10> *)
                                   (pTVar5->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>).
                                  _vptr_TPZVec + lVar19) + 0x18))
              ((long)&(((TPZManVector<std::complex<double>,_10> *)(pTVar5->fExtAlloc + -2))->
                      super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar19,2);
    local_48._M_value._0_8_ = 0;
    local_48._M_value._8_8_ = 0;
    TPZVec<std::complex<double>_>::Fill
              ((TPZVec<std::complex<double>_> *)
               ((long)&(((TPZManVector<std::complex<double>,_10> *)
                        (((sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore)->
                         fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec +
               lVar19),&local_48,0,-1);
    pTVar5 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
    (**(code **)(*(long *)((long)&(((TPZManVector<std::complex<double>,_10> *)
                                   (pTVar5->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>).
                                  _vptr_TPZVec + lVar19) + 0x18))
              ((long)&(((TPZManVector<std::complex<double>,_10> *)(pTVar5->fExtAlloc + -2))->
                      super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar19,1);
    local_48._M_value._0_8_ = 0;
    local_48._M_value._8_8_ = 0;
    TPZVec<std::complex<double>_>::Fill
              ((TPZVec<std::complex<double>_> *)
               ((long)&(((TPZManVector<std::complex<double>,_10> *)
                        (((curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore)->
                         fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec +
               lVar19),&local_48,0,-1);
    lVar19 = lVar19 + 0xc0;
  }
  pTVar12 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  lVar19 = 0;
  for (iVar16 = 0; iVar16 != iVar10; iVar16 = iVar16 + 1) {
    lVar18 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                    super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                    super_TPZCompEl + 0xa8))();
    pTVar6 = (pTVar12->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
    uVar3 = pTVar6[*(int *)(lVar18 + 8)].dim;
    iVar4 = pTVar6[*(int *)(lVar18 + 8)].pos;
    lVar19 = (long)(int)lVar19;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
      for (lVar18 = 0; lVar18 != lVar17; lVar18 = lVar18 + 1) {
        lVar15 = 0;
        col = 0;
        while( true ) {
          pcVar13 = TPZFMatrix<std::complex<double>_>::operator()
                              (this_00,uVar14 + (long)iVar4,lVar18);
          dVar7 = *(double *)pcVar13->_M_value;
          dVar8 = *(double *)(pcVar13->_M_value + 8);
          if (col == 2) break;
          dVar21 = TPZFMatrix<double>::operator()(phiHCurl,lVar19,col);
          pcVar13 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore[lVar18].
                    super_TPZVec<std::complex<double>_>.fStore;
          pdVar1 = (double *)(pcVar13->_M_value + lVar15);
          dVar9 = pdVar1[1];
          pdVar2 = (double *)(pcVar13->_M_value + lVar15);
          *pdVar2 = *pdVar1 + dVar7 * dVar21;
          pdVar2[1] = dVar9 + dVar8 * dVar21;
          col = col + 1;
          lVar15 = lVar15 + 0x10;
        }
        (*(curlPhi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x21])(curlPhi,0,lVar19);
        pcVar13 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore[lVar18].
                  super_TPZVec<std::complex<double>_>.fStore;
        dVar9 = *(double *)(pcVar13->_M_value + 8);
        *(double *)pcVar13->_M_value = *(double *)pcVar13->_M_value + dVar7 * extraout_XMM0_Qa;
        *(double *)(pcVar13->_M_value + 8) = dVar9 + dVar8 * extraout_XMM0_Qa;
      }
      lVar19 = lVar19 + 1;
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}